

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_mem.c
# Opt level: O3

void empty_blocklist(amqp_pool_blocklist_t *x)

{
  long lVar1;
  
  if (0 < x->num_blocks) {
    lVar1 = 0;
    do {
      free(x->blocklist[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < x->num_blocks);
  }
  if (x->blocklist != (void **)0x0) {
    free(x->blocklist);
  }
  x->num_blocks = 0;
  x->blocklist = (void **)0x0;
  return;
}

Assistant:

static void empty_blocklist(amqp_pool_blocklist_t *x)
{
  int i;

  for (i = 0; i < x->num_blocks; i++) {
    free(x->blocklist[i]);
  }
  if (x->blocklist != NULL) {
    free(x->blocklist);
  }
  x->num_blocks = 0;
  x->blocklist = NULL;
}